

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDAGetQuadSensErrWeights(void *ida_mem,N_Vector *eQSweight)

{
  int iVar1;
  long in_RSI;
  IDAMem in_RDI;
  int Ns;
  int is;
  IDAMem IDA_mem;
  int local_24;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x731,"IDAGetQuadSensErrWeights",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_quadr_sensi == 0) {
    IDAProcessError(in_RDI,-0x32,0x739,"IDAGetQuadSensErrWeights",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"Forward sensitivity analysis for quadrature variables was not activated.");
    local_4 = -0x32;
  }
  else {
    iVar1 = in_RDI->ida_Ns;
    if (in_RDI->ida_errconQS != 0) {
      for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
        N_VScale(0x3ff0000000000000,in_RDI->ida_ewtQS[local_24],
                 *(undefined8 *)(in_RSI + (long)local_24 * 8));
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetQuadSensErrWeights(void* ida_mem, N_Vector* eQSweight)
{
  IDAMem IDA_mem;
  int is, Ns;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadr_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    return (IDA_NO_QUADSENS);
  }
  Ns = IDA_mem->ida_Ns;

  if (IDA_mem->ida_errconQS)
  {
    for (is = 0; is < Ns; is++)
    {
      N_VScale(ONE, IDA_mem->ida_ewtQS[is], eQSweight[is]);
    }
  }

  return (IDA_SUCCESS);
}